

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlsearch.c
# Opt level: O0

int XMLSearch_free(XMLSearch *search,int free_next)

{
  int local_20;
  int i;
  int free_next_local;
  XMLSearch *search_local;
  
  if ((search == (XMLSearch *)0x0) || (search->init_value != 0x19770522)) {
    search_local._4_4_ = 0;
  }
  else {
    if (search->tag != (SXML_CHAR *)0x0) {
      free(search->tag);
      search->tag = (SXML_CHAR *)0x0;
    }
    if (search->attributes != (XMLAttribute *)0x0) {
      for (local_20 = 0; local_20 < search->n_attributes; local_20 = local_20 + 1) {
        if (search->attributes[local_20].name != (SXML_CHAR *)0x0) {
          free(search->attributes[local_20].name);
        }
        if (search->attributes[local_20].value != (SXML_CHAR *)0x0) {
          free(search->attributes[local_20].value);
        }
      }
      free(search->attributes);
      search->n_attributes = 0;
      search->attributes = (XMLAttribute *)0x0;
    }
    if (search->text != (SXML_CHAR *)0x0) {
      free(search->text);
      search->text = (SXML_CHAR *)0x0;
    }
    if ((free_next != 0) && (search->next != (_XMLSearch *)0x0)) {
      XMLSearch_free(search->next,1);
      free(search->next);
      search->next = (_XMLSearch *)0x0;
    }
    search->init_value = 0;
    XMLSearch_init(search);
    search_local._4_4_ = 1;
  }
  return search_local._4_4_;
}

Assistant:

int XMLSearch_free(XMLSearch* search, int free_next)
{
	int i;

	if (search == NULL || search->init_value != XML_INIT_DONE)
		return FALSE;

	if (search->tag != NULL) {
		__free(search->tag);
		search->tag = NULL;
	}

	if (search->attributes != NULL) {
		for (i = 0; i < search->n_attributes; i++) {
			if (search->attributes[i].name != NULL)
				__free(search->attributes[i].name);
			if (search->attributes[i].value != NULL)
				__free(search->attributes[i].value);
		}
		__free(search->attributes);
		search->n_attributes = 0;
		search->attributes = NULL;
	}

	if (search->text != NULL) {
		__free(search->text);
		search->text = NULL;
	}

	if (free_next && search->next != NULL) {
		(void)XMLSearch_free(search->next, TRUE);
		__free(search->next);
		search->next = NULL;
	}
	search->init_value = 0; /* Something not XML_INIT_DONE, otherwise we'll go into 'XMLSearch_free' again */
	(void)XMLSearch_init(search);

	return TRUE;
}